

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O3

void __thiscall CDT::train(CDT *this)

{
  pointer pLVar1;
  ostream *poVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  ulong uVar4;
  char local_39;
  Shape local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Training..\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Input shape: ",0xd);
  local_38.n_row = (this->m_input).m_shape.n_row;
  local_38.n_col = (this->m_input).m_shape.n_col;
  local_38.is_diogonal = (this->m_input).m_shape.is_diogonal;
  poVar2 = operator<<((ostream *)&std::cout,&local_38);
  local_39 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_39,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Output shape: ",0xe);
  local_38.n_row = (this->m_output).m_shape.n_row;
  local_38.n_col = (this->m_output).m_shape.n_col;
  local_38.is_diogonal = (this->m_output).m_shape.is_diogonal;
  poVar2 = operator<<((ostream *)&std::cout,&local_38);
  local_39 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_39,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initial weights: ",0x11)
  ;
  pLVar1 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pLVar1->m_weights).m_shape.n_col != 0) {
    uVar4 = 0;
    do {
      pvVar3 = Matrix<double>::operator[](&pLVar1->m_weights,0);
      poVar2 = std::ostream::_M_insert<double>
                         ((pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      uVar4 = uVar4 + 1;
      pLVar1 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar4 < (pLVar1->m_weights).m_shape.n_col);
  }
  local_38.n_row._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_38,1);
  adjust_weights(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Updated weights: ",0x11)
  ;
  pLVar1 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pLVar1->m_weights).m_shape.n_col != 0) {
    uVar4 = 0;
    do {
      pvVar3 = Matrix<double>::operator[](&pLVar1->m_weights,0);
      poVar2 = std::ostream::_M_insert<double>
                         ((pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      uVar4 = uVar4 + 1;
      pLVar1 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar4 < (pLVar1->m_weights).m_shape.n_col);
  }
  local_38.n_row._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_38,1);
  return;
}

Assistant:

void CDT::train(){
    std::cout<<"Training..\n";
    std::cout<<"Input shape: "<<m_input.shape()<<'\n';
    std::cout<<"Output shape: "<<m_output.shape()<<'\n';

    std::cout<<"Initial weights: ";
    for(unsigned i=0;i<m_layers[0].m_weights.shape().n_col;++i){
        std::cout<<m_layers[0].m_weights[0][i]<<" ";
    }   std::cout<<'\n';

    adjust_weights();
    adjust_activation();

    std::cout<<"Updated weights: ";
    for(unsigned i=0;i<m_layers[0].m_weights.shape().n_col;++i){
        std::cout<<m_layers[0].m_weights[0][i]<<" ";
    }   std::cout<<'\n';
}